

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O3

void IT8951MemBurstWriteProc(uint32_t ulMemAddr,uint32_t ulWriteSize,uint16_t *pSrcBuf)

{
  ulong uVar1;
  
  IT8951MemBurstWrite(ulMemAddr,ulWriteSize);
  if (ulWriteSize != 0) {
    uVar1 = 0;
    do {
      LCDWriteData(pSrcBuf[uVar1]);
      uVar1 = uVar1 + 1;
    } while (ulWriteSize != uVar1);
  }
  LCDWriteCmdCode(0x15);
  return;
}

Assistant:

void IT8951MemBurstWriteProc(uint32_t ulMemAddr , uint32_t ulWriteSize, uint16_t* pSrcBuf )
{
    
    uint32_t i;
 
    //Send Burst Write Start Cmd and Args
    IT8951MemBurstWrite(ulMemAddr , ulWriteSize);
 
    //Burst Write Data
    for(i=0;i<ulWriteSize;i++)
    {
        LCDWriteData(pSrcBuf[i]);
    }
 
    //Send Burst End Cmd
    IT8951MemBurstEnd();
}